

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator f;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_100;
  region<std::vector<char,_std::allocator<char>_>_> local_b0;
  region<std::vector<char,_std::allocator<char>_>_> local_68;
  
  f._M_current = *(char **)(this + 0x40);
  if (f._M_current == *(char **)(*(long *)(this + 8) + 8)) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (&local_100,
               (either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
                *)this,loc);
    if (local_100.is_ok_ == true) {
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,f);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,
                 (const_iterator)(f._M_current + 1));
      region<std::vector<char,_std::allocator<char>_>_>::region
                (&local_b0,(location<std::vector<char,_std::allocator<char>_>_> *)this,
                 (const_iterator)f._M_current,(const_iterator)*(char **)(this + 0x40));
      region<std::vector<char,_std::allocator<char>_>_>::region(&local_68,&local_b0);
      f._M_current = (char *)&local_68;
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,(success_type *)&local_68);
      region<std::vector<char,_std::allocator<char>_>_>::~region(&local_68);
      region<std::vector<char,_std::allocator<char>_>_>::~region(&local_b0);
    }
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    cleanup(&local_100,(EVP_PKEY_CTX *)f._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        if(loc.iter() == loc.end()) {return none();}
        auto first = loc.iter();

        auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            loc.reset(first);
            return none();
        }
        loc.reset(std::next(first)); // XXX maybe loc.advance() is okay but...
        return ok(region<Cont>(loc, first, loc.iter()));
    }